

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# troff_display_driver.cpp
# Opt level: O1

void __thiscall TroffDisplayDriver::display(TroffDisplayDriver *this,Document *doc,ostream *output)

{
  char cVar1;
  undefined4 uVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  char *pcVar9;
  char cVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  Document *local_40;
  ulong local_38;
  
  lVar4 = Document::size();
  if (lVar4 != 0) {
    uVar11 = 0;
    local_40 = doc;
    do {
      local_38 = uVar11;
      plVar5 = (long *)Document::operator[]((ulong)doc);
      uVar2 = (**(code **)(*plVar5 + 8))(plVar5);
      cVar1 = (char)output;
      switch(uVar2) {
      case 1:
        pcVar9 = ".TH ";
        break;
      case 2:
        pcVar9 = ".SH ";
        break;
      case 3:
        pcVar9 = ".SS ";
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>(output,".PP",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        cVar10 = cVar1;
        goto LAB_00123799;
      case 8:
        std::__ostream_insert<char,std::char_traits<char>>(output,".TP",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".BR ",4);
        cVar10 = (char)poVar7;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar10);
LAB_00123799:
        std::ostream::put(cVar10);
        std::ostream::flush();
        goto LAB_001237a6;
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar9,4);
LAB_001237a6:
      lVar4 = Paragraph::size();
      if (lVar4 != 0) {
        uVar11 = 0;
        local_48 = plVar5;
        do {
          plVar5 = (long *)Paragraph::operator[]((ulong)plVar5);
          if (plVar5 == (long *)0x0) {
            lVar4 = 0;
            bVar12 = false;
            bVar13 = true;
            lVar6 = 0;
          }
          else {
            lVar4 = __dynamic_cast(plVar5,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
            lVar6 = __dynamic_cast(plVar5,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
            bVar12 = lVar6 != 0;
            lVar6 = __dynamic_cast(plVar5,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
            bVar13 = lVar6 == 0;
            lVar6 = __dynamic_cast(plVar5,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
          }
          if (bVar12) {
            pcVar9 = "\\fI";
LAB_00123899:
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar9,3);
          }
          else {
            if (lVar4 != 0) {
              pcVar9 = "\\fB";
              goto LAB_00123899;
            }
            if (!bVar13) {
              (**(code **)(*local_48 + 8))();
            }
          }
          if (lVar6 == 0) {
            (**(code **)(*plVar5 + 0x10))(&local_68,plVar5);
            std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_68,local_60);
          }
          else {
            std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
            std::ostream::put(cVar1);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,".IR ",4);
            UrlLineElement::url_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_68,local_60);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          plVar5 = local_48;
          if ((bool)(bVar12 | lVar4 != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>(output,"\\fR",3);
            plVar5 = local_48;
          }
          else if (!bVar13) {
            (**(code **)(*local_48 + 8))(local_48);
          }
          uVar11 = uVar11 + 1;
          uVar8 = Paragraph::size();
        } while (uVar11 < uVar8);
      }
      uVar3 = (**(code **)(*plVar5 + 8))(plVar5);
      if ((uVar3 & 0xfffffffe) != 10) {
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
      }
      doc = local_40;
      uVar11 = local_38 + 1;
      uVar8 = Document::size();
    } while (uVar11 < uVar8);
  }
  return;
}

Assistant:

void TroffDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		is_quotation(false),
		is_ulist(false);

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << ".TH ";
				break;
			case Paragraph::Level::Title2:
				output << ".SH ";
				break;
			case Paragraph::Level::Title3:
				output << ".SS ";
				break;
			case Paragraph::Level::UList1:
				output << ".TP" << endl << ".BR " << endl;
				break;
			case Paragraph::Level::Code:
			case Paragraph::Level::Quote:
			default:
				output << ".PP" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "\\fI";
			} else if (bold_le) {
				output << "\\fB";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
			
			if (url_le) {
				output << endl << ".IR " << url_le->url() << endl;
			} else {
				output << l->content();
			}

			if (italic_le or bold_le) {
				output << "\\fR";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				break;
			case Paragraph::Level::Quote:
				break;
			case Paragraph::Level::UList1:
			case Paragraph::Level::Title1:
			case Paragraph::Level::Title2:
			default:
				output << endl;
				break;
		}
	}
}